

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  size_t length;
  int *piVar1;
  uchar filterType;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  size_t i;
  uchar *scanline;
  uchar *puVar6;
  void *pvVar7;
  ulong uVar8;
  LodePNGFilterStrategy LVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uchar *puVar22;
  long lVar23;
  bool bVar24;
  uchar *local_4e8;
  uchar *local_4e0;
  uchar *local_4d0;
  uchar *dummy;
  ulong local_4a0;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  
  uVar15 = (ulong)h;
  uVar5 = lodepng_get_bpp(color);
  lVar14 = (ulong)uVar5 * (ulong)(w >> 3);
  uVar10 = (ulong)((w & 7) * uVar5 + 7 >> 3);
  length = lVar14 + uVar10;
  lVar14 = lVar14 + uVar10 + 1;
  uVar10 = (ulong)(uVar5 + 7 >> 3);
  LVar9 = settings->filter_strategy;
  if ((settings->filter_palette_zero == 0) ||
     ((color->colortype != LCT_PALETTE && (7 < color->bitdepth)))) {
    if (uVar5 == 0) {
      return 0x1f;
    }
    if (LVar9 < LFS_MINSUM) goto LAB_00120352;
    switch(LVar9) {
    case LFS_MINSUM:
      uVar5 = 0;
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        puVar6 = (uchar *)malloc(length);
        attempt[lVar16] = puVar6;
        if (puVar6 == (uchar *)0x0) {
          uVar5 = 0x53;
        }
      }
      if (uVar5 == 0) {
        uVar19 = 0;
        uVar15 = 0;
        local_4e8 = (uchar *)0x0;
        for (uVar21 = 0; uVar21 != h; uVar21 = uVar21 + 1) {
          lVar16 = length * uVar21;
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            puVar6 = attempt[uVar17];
            filterScanline(puVar6,in + lVar16,local_4e8,length,uVar10,(uchar)uVar17);
            uVar8 = 0;
            uVar13 = 0;
            if (uVar17 == 0) {
              for (; length != uVar13; uVar13 = uVar13 + 1) {
                uVar8 = uVar8 + puVar6[uVar13];
              }
            }
            else {
              for (; length != uVar13; uVar13 = uVar13 + 1) {
                bVar2 = puVar6[uVar13];
                uVar3 = bVar2 ^ 0xff;
                if (-1 < (char)bVar2) {
                  uVar3 = (uint)bVar2;
                }
                uVar8 = uVar8 + uVar3;
              }
            }
            bVar24 = uVar8 < uVar19;
            if (bVar24 || uVar17 == 0) {
              uVar19 = uVar8;
            }
            if (bVar24 || uVar17 == 0) {
              uVar15 = uVar17 & 0xff;
            }
          }
          out[lVar14 * uVar21] = (uchar)uVar15;
          for (uVar13 = 0; uVar17 = (ulong)uVar13, length != uVar17; uVar13 = uVar13 + 1) {
            out[uVar17 + lVar14 * uVar21 + 1] = attempt[uVar15][uVar17];
          }
          local_4e8 = in + lVar16;
        }
      }
      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
        free(attempt[lVar14]);
      }
      break;
    case LFS_ENTROPY:
      uVar5 = 0;
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        pvVar7 = malloc(length);
        size[lVar16] = (size_t)pvVar7;
        if (pvVar7 == (void *)0x0) {
          uVar5 = 0x53;
        }
      }
      if (uVar5 == 0) {
        uVar15 = 0;
        uVar19 = 0;
        local_4d0 = (uchar *)0x0;
        for (uVar21 = 0; uVar21 != h; uVar21 = uVar21 + 1) {
          lVar16 = length * uVar21;
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            puVar6 = (uchar *)size[uVar17];
            filterScanline(puVar6,in + lVar16,local_4d0,length,uVar10,(uchar)uVar17);
            for (lVar23 = 0; lVar23 != 0x400; lVar23 = lVar23 + 1) {
              *(undefined1 *)((long)attempt + lVar23) = 0;
            }
            for (uVar13 = 0; length != uVar13; uVar13 = uVar13 + 1) {
              piVar1 = (int *)((long)attempt + (ulong)puVar6[uVar13] * 4);
              *piVar1 = *piVar1 + 1;
            }
            piVar1 = (int *)((long)attempt + uVar17 * 4);
            *piVar1 = *piVar1 + 1;
            uVar8 = 0;
            for (lVar23 = 0; lVar23 != 0x100; lVar23 = lVar23 + 1) {
              uVar13 = *(uint *)((long)attempt + lVar23 * 4);
              uVar18 = (ulong)uVar13;
              if (uVar18 == 0) {
                lVar12 = 0;
              }
              else {
                uVar11 = (ulong)(uVar13 >> 0x10);
                if (0xffff >= uVar13) {
                  uVar11 = uVar18;
                }
                lVar20 = (ulong)(0xffff < uVar13) * 0x10;
                lVar12 = lVar20 + 8;
                uVar4 = uVar11 >> 8;
                if (uVar11 < 0x100) {
                  lVar12 = lVar20;
                  uVar4 = uVar11;
                }
                lVar20 = lVar12 + 4;
                uVar11 = uVar4 >> 4;
                if (uVar4 < 0x10) {
                  lVar20 = lVar12;
                  uVar11 = uVar4;
                }
                uVar13 = (uint)(uVar11 >> 2);
                lVar12 = lVar20 + 2;
                if (uVar11 < 4) {
                  uVar13 = (uint)uVar11;
                  lVar12 = lVar20;
                }
                lVar12 = (lVar12 + 1) - (ulong)(uVar13 < 2);
                lVar12 = lVar12 * uVar18 + (uVar18 - (uint)(1 << ((byte)lVar12 & 0x1f))) * 2;
              }
              uVar8 = uVar8 + lVar12;
            }
            if (uVar15 < uVar8 || uVar17 == 0) {
              uVar19 = uVar17 & 0xffffffff;
              uVar15 = uVar8;
            }
          }
          out[lVar14 * uVar21] = (uchar)uVar19;
          for (uVar13 = 0; uVar17 = (ulong)uVar13, length != uVar17; uVar13 = uVar13 + 1) {
            out[uVar17 + lVar14 * uVar21 + 1] = *(uchar *)(size[uVar19] + uVar17);
          }
          local_4d0 = in + lVar16;
        }
      }
      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
        free((void *)size[lVar14]);
      }
      break;
    case LFS_BRUTE_FORCE:
      lodepng_memcpy(attempt,settings,0x30);
      attempt[0]._0_4_ = 1;
      attempt[3] = (uchar *)0x0;
      attempt[4] = (uchar *)0x0;
      uVar5 = 0;
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        puVar6 = (uchar *)malloc(length);
        attempt_1[lVar16] = puVar6;
        if (puVar6 == (uchar *)0x0) {
          uVar5 = 0x53;
        }
      }
      if (uVar5 == 0) {
        local_4a0 = (ulong)h;
        local_4d0 = (uchar *)0x0;
        uVar15 = 0;
        uVar21 = 0;
        for (uVar19 = 0; uVar19 != local_4a0; uVar19 = uVar19 + 1) {
          lVar16 = length * uVar19;
          lVar23 = 0;
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            puVar6 = attempt_1[uVar17];
            filterScanline(puVar6,in + lVar16,local_4d0,length,uVar10,(uchar)uVar17);
            size[uVar17] = 0;
            dummy = (uchar *)0x0;
            zlib_compress(&dummy,(size_t *)((long)size + lVar23),puVar6,length & 0xffffffff,
                          (LodePNGCompressSettings *)attempt);
            free(dummy);
            if (size[uVar17] < uVar15 || lVar23 == 0) {
              uVar21 = uVar17 & 0xffffffff;
              uVar15 = size[uVar17];
            }
            lVar23 = lVar23 + 8;
          }
          out[lVar14 * uVar19] = (uchar)uVar21;
          for (uVar13 = 0; uVar17 = (ulong)uVar13, length != uVar17; uVar13 = uVar13 + 1) {
            out[uVar17 + lVar14 * uVar19 + 1] = attempt_1[uVar21][uVar17];
          }
          local_4d0 = in + lVar16;
        }
      }
      for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
        free(attempt_1[lVar14]);
      }
      break;
    case LFS_PREDEFINED:
      local_4e0 = out + 1;
      puVar6 = (uchar *)0x0;
      for (uVar15 = 0; puVar22 = in, h != uVar15; uVar15 = uVar15 + 1) {
        filterType = settings->predefined_filters[uVar15];
        local_4e0[-1] = filterType;
        filterScanline(local_4e0,puVar22,puVar6,length,uVar10,filterType);
        local_4e0 = local_4e0 + lVar14;
        in = puVar22 + length;
        puVar6 = puVar22;
      }
      goto LAB_001204d0;
    default:
      uVar5 = 0x58;
    }
  }
  else {
    LVar9 = LFS_ZERO;
    if (uVar5 == 0) {
      return 0x1f;
    }
LAB_00120352:
    puVar22 = out + 1;
    puVar6 = (uchar *)0x0;
    while (scanline = in, bVar24 = uVar15 != 0, uVar15 = uVar15 - 1, bVar24) {
      puVar22[-1] = (uchar)LVar9;
      filterScanline(puVar22,scanline,puVar6,length,uVar10,(uchar)LVar9);
      puVar22 = puVar22 + lVar14;
      in = scanline + length;
      puVar6 = scanline;
    }
LAB_001204d0:
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (color->colortype == LCT_PALETTE || color->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}